

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

void __thiscall QToolBarAreaLayout::deleteAllLayoutItems(QToolBarAreaLayout *this)

{
  qsizetype qVar1;
  reference pQVar2;
  reference pQVar3;
  long in_RDI;
  QToolBarAreaLayoutItem *item;
  int k;
  QToolBarAreaLayoutLine *line;
  int j;
  QToolBarAreaLayoutInfo *dock;
  int i;
  QLayoutItem *in_stack_ffffffffffffffa8;
  QList<QToolBarAreaLayoutLine> *in_stack_ffffffffffffffb0;
  int local_2c;
  int local_1c;
  int local_c;
  
  for (local_c = 0; local_c < 4; local_c = local_c + 1) {
    for (local_1c = 0;
        qVar1 = QList<QToolBarAreaLayoutLine>::size
                          ((QList<QToolBarAreaLayoutLine> *)(in_RDI + 0x18 + (long)local_c * 0x38)),
        local_1c < qVar1; local_1c = local_1c + 1) {
      pQVar2 = QList<QToolBarAreaLayoutLine>::operator[]
                         (in_stack_ffffffffffffffb0,(qsizetype)in_stack_ffffffffffffffa8);
      local_2c = 0;
      while( true ) {
        in_stack_ffffffffffffffb0 = (QList<QToolBarAreaLayoutLine> *)(long)local_2c;
        qVar1 = QList<QToolBarAreaLayoutItem>::size(&pQVar2->toolBarItems);
        if (qVar1 <= (long)in_stack_ffffffffffffffb0) break;
        pQVar3 = QList<QToolBarAreaLayoutItem>::operator[]
                           ((QList<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffffb0,
                            (qsizetype)in_stack_ffffffffffffffa8);
        if (((pQVar3->gap & 1U) == 0) &&
           (in_stack_ffffffffffffffa8 = pQVar3->widgetItem,
           in_stack_ffffffffffffffa8 != (QLayoutItem *)0x0)) {
          (*in_stack_ffffffffffffffa8->_vptr_QLayoutItem[1])();
        }
        pQVar3->widgetItem = (QLayoutItem *)0x0;
        local_2c = local_2c + 1;
      }
    }
  }
  return;
}

Assistant:

void QToolBarAreaLayout::deleteAllLayoutItems()
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            QToolBarAreaLayoutLine &line = dock.lines[j];

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                QToolBarAreaLayoutItem &item = line.toolBarItems[k];
                if (!item.gap)
                    delete item.widgetItem;
                item.widgetItem = nullptr;
            }
        }
    }
}